

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

Element * __thiscall
wasm::analysis::Vector<wasm::RandomFullLattice>::getBottom
          (Element *__return_storage_ptr__,Vector<wasm::RandomFullLattice> *this)

{
  size_type __n;
  RandomFullLattice local_38;
  allocator_type local_21;
  
  __n = this->size;
  RandomFullLattice::getBottom(&local_38);
  std::
  vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
  ::vector(__return_storage_ptr__,__n,(value_type *)&local_38,&local_21);
  if ((_Tuple_impl<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
       )local_38.lattice._M_t.
        super___uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
        .super__Head_base<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_false>._M_head_impl !=
      (LatticeImpl *)0x0) {
    (*(code *)local_38.rand)();
  }
  return __return_storage_ptr__;
}

Assistant:

Element getBottom() const noexcept {
    return Element(size, lattice.getBottom());
  }